

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

ssize_t __thiscall
pstore::romfs::descriptor::read(descriptor *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  undefined4 in_register_00000034;
  size_t sVar7;
  
  if (__nbytes == 0 || __buf == (void *)0x0) {
    __nbytes = 0;
  }
  else {
    peVar1 = (this->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    sVar2 = peVar1->pos_;
    uVar3 = (peVar1->dir_->stat_).size;
    pvVar4 = (peVar1->dir_->contents_).ptr_;
    lVar6 = 0;
    sVar7 = 0;
    sVar5 = sVar2;
    do {
      if (uVar3 < sVar5 + (long)__buf) {
        return sVar7;
      }
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + lVar6),
             (void *)((long)pvVar4 + lVar6 + sVar2),(size_t)__buf);
      sVar5 = peVar1->pos_ + (long)__buf;
      peVar1->pos_ = sVar5;
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + (long)__buf;
    } while (__nbytes != sVar7);
  }
  return __nbytes;
}

Assistant:

std::size_t descriptor::read (not_null<void *> const buffer, std::size_t const size,
                                      std::size_t const count) {
            return f_->read (buffer, size, count);
        }